

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddrParser.cpp
# Opt level: O3

bool __thiscall axl::io::SockAddrParser::tryInt(SockAddrParser *this,int radix)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  skipWhiteSpace(this);
  pcVar1 = this->m_p;
  pcVar2 = this->m_end;
  if (radix == 0x10) {
    pcVar4 = pcVar1;
    if (pcVar2 <= pcVar1) {
      return false;
    }
    do {
      iVar3 = isxdigit((int)*pcVar4);
      pcVar5 = pcVar4;
      if (iVar3 == 0) break;
      pcVar4 = pcVar4 + 1;
      pcVar5 = pcVar2;
    } while (pcVar4 != pcVar2);
  }
  else {
    pcVar4 = pcVar1;
    if (pcVar2 <= pcVar1) {
      return false;
    }
    do {
      pcVar5 = pcVar4;
      if (9 < (int)*pcVar4 - 0x30U) break;
      pcVar4 = pcVar4 + 1;
      pcVar5 = pcVar2;
    } while (pcVar4 != pcVar2);
  }
  if (pcVar1 == pcVar5) {
    return false;
  }
  this->m_p = pcVar5;
  return true;
}

Assistant:

bool
SockAddrParser::tryInt(int radix) {
	skipWhiteSpace();

	const char* p = m_p;

	if (radix == 16) {
		while (p < m_end && isxdigit(*p))
			p++;
	} else {
		while (p < m_end && isdigit(*p))
			p++;
	}

	if (m_p == p)
		return false;

	m_p = p;
	return true;
}